

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScenePrivate::drawSubtreeRecursive
          (QGraphicsScenePrivate *this,QGraphicsItem *item,QPainter *painter,
          QTransform *viewTransform,QRegion *exposedRegion,QWidget *widget,qreal parentOpacity,
          QTransform *effectTransform)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  undefined1 uVar4;
  CoordinateSystem CVar5;
  int iVar6;
  QGraphicsItemPrivate *pQVar7;
  QGraphicsEffectSourcePrivate *this_00;
  void *pvVar8;
  QTransform *pQVar9;
  ulong uVar10;
  QTransform *in_RCX;
  QGraphicsEffectSourcePrivate *in_RDX;
  qreal in_RSI;
  QRegion *in_RDI;
  QRegion *in_R8;
  QWidget *in_R9;
  uint uVar11;
  long in_FS_OFFSET;
  bool bVar12;
  qreal opacity_00;
  qreal qVar13;
  QTransform *in_stack_00000008;
  QGraphicsItemEffectSourcePrivate *sourced;
  QGraphicsEffectSource *source;
  bool itemIsOutsideVisibleRect;
  bool itemIsTooSmallToRender;
  bool drawItem;
  bool itemClipsChildrenToShape;
  bool itemIsUntransformable;
  bool wasDirtyParentSceneTransform;
  bool translateOnlyTransform;
  QTransform *transformPtr;
  bool itemIsFullyTransparent;
  qreal opacity;
  bool itemHasChildren;
  bool itemHasContents;
  QRect effectRect;
  QRectF sourceRect;
  QRect viewBoundingRect;
  QRectF preciseViewBoundingRect;
  QRectF brect;
  QGraphicsItemPaintInfo info;
  QTransform restoreTransform;
  QTransform transform;
  QWidget **in_stack_fffffffffffffc38;
  QStyleOptionGraphicsItem *opt;
  QRect *in_stack_fffffffffffffc40;
  QGraphicsEffectSourcePrivate *pQVar14;
  int in_stack_fffffffffffffc48;
  int in_stack_fffffffffffffc4c;
  undefined4 in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc54;
  undefined8 in_stack_fffffffffffffc60;
  QGraphicsItemEffectSourcePrivate *this_01;
  QTransform *in_stack_fffffffffffffc88;
  QGraphicsItem *in_stack_fffffffffffffc90;
  byte local_342;
  byte local_341;
  byte drawItem_00;
  undefined1 wasDirtyParentSceneTransform_00;
  qreal in_stack_fffffffffffffcd0;
  QTransform *in_stack_fffffffffffffce0;
  QTransform *in_stack_fffffffffffffce8;
  piter in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffd00;
  byte in_stack_fffffffffffffd01;
  byte in_stack_fffffffffffffd02;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  QTransform *local_2f8;
  QPoint local_2a8 [3];
  QWidget *in_stack_fffffffffffffd70;
  QTransform *in_stack_fffffffffffffd78;
  undefined8 local_270;
  undefined8 local_268;
  undefined8 local_260;
  undefined8 local_258;
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  QRectF local_230;
  undefined8 local_210;
  undefined8 local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  QWidget *local_1f0;
  QGraphicsItemPaintInfo local_1e8;
  QTransform local_1a0;
  undefined1 local_150 [80];
  undefined1 local_100 [80];
  undefined1 local_b0 [80];
  QTransform local_60;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_1f0 = in_R9;
  pQVar7 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)((long)in_RSI + 8));
  if ((*(ulong *)&pQVar7->field_0x160 >> 5 & 1) == 0) goto LAB_009d77db;
  pQVar7 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)((long)in_RSI + 8));
  bVar12 = (*(ulong *)&pQVar7->field_0x160 & 0x40000000000) == 0;
  QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
            ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *)
             ((long)in_RSI + 8));
  bVar1 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0x9d6ab0);
  bVar2 = (bVar1 ^ 0xffU) & 1;
  if ((!bVar12) && (bVar2 == 0)) goto LAB_009d77db;
  QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
            ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *)
             ((long)in_RSI + 8));
  opacity_00 = QGraphicsItemPrivate::combineOpacityFromParent
                         ((QGraphicsItemPrivate *)
                          CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                          (qreal)in_stack_fffffffffffffc40);
  bVar1 = QGraphicsItemPrivate::isOpacityNull(opacity_00);
  if (bVar1) {
    if (bVar2 == 0) goto LAB_009d77db;
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *
               )((long)in_RSI + 8));
    bVar3 = QGraphicsItemPrivate::childrenCombineOpacity
                      ((QGraphicsItemPrivate *)
                       CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    if (bVar3) goto LAB_009d77db;
  }
  memcpy(&local_60,&DAT_00b450d8,0x50);
  QTransform::QTransform(&local_60,Uninitialized);
  local_2f8 = (QTransform *)0x0;
  bVar17 = 0;
  bVar16 = 0;
  pQVar7 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)((long)in_RSI + 8));
  uVar4 = QGraphicsItemPrivate::itemIsUntransformable(pQVar7);
  if ((bool)uVar4) {
    in_stack_fffffffffffffcd0 = in_RSI;
    if (in_RCX == (QTransform *)0x0) {
      QTransform::QTransform((QTransform *)in_stack_fffffffffffffc40);
    }
    else {
      memcpy(local_100,in_RCX,0x4a);
    }
    QGraphicsItem::deviceTransform(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    memcpy(&local_60,local_b0,0x4a);
    local_2f8 = &local_60;
  }
  else {
    pQVar7 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)((long)in_RSI + 8));
    if ((*(ulong *)&pQVar7->field_0x160 >> 0x35 & 1) != 0) {
      pQVar7 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)((long)in_RSI + 8));
      (*pQVar7->_vptr_QGraphicsItemPrivate[2])();
      bVar16 = 1;
    }
  }
  pQVar7 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)((long)in_RSI + 8));
  wasDirtyParentSceneTransform_00 = true;
  if ((*(ulong *)&pQVar7->field_0x160 & 0x1000000000) == 0) {
    pQVar7 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)((long)in_RSI + 8));
    wasDirtyParentSceneTransform_00 = (*(ulong *)&pQVar7->field_0x160 & 0x8000000000000) != 0;
  }
  drawItem_00 = 0;
  if (bVar12) {
    drawItem_00 = bVar1 ^ 0xff;
  }
  local_341 = drawItem_00 & 1;
  bVar15 = wasDirtyParentSceneTransform_00;
  if ((local_341 != 0) || (0.0 < (double)in_RDI[0x18].d)) {
    local_210 = 0xffffffffffffffff;
    local_208 = 0xffffffffffffffff;
    local_200 = 0xffffffffffffffff;
    local_1f8 = 0xffffffffffffffff;
    adjustedItemEffectiveBoundingRect((QGraphicsItem *)in_stack_fffffffffffffc40);
    if (local_2f8 == (QTransform *)0x0) {
      if (in_RCX == (QTransform *)0x0) {
        pQVar7 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                               *)((long)in_RSI + 8));
        local_2f8 = &pQVar7->sceneTransform;
        pQVar7 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                               *)((long)in_RSI + 8));
        bVar17 = (*(ulong *)&pQVar7->field_0x160 >> 0x3e & 1) != 0;
      }
      else {
        pQVar7 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                               *)((long)in_RSI + 8));
        memcpy(&local_60,&pQVar7->sceneTransform,0x4a);
        QTransform::operator*=(&local_60,(QTransform *)in_RCX);
        local_2f8 = &local_60;
      }
    }
    local_230.xp = -NAN;
    local_230.yp = -NAN;
    local_230.w = -NAN;
    local_230.h = -NAN;
    if ((bVar17 & 1) == 0) {
      QTransform::mapRect((QRectF *)&local_230);
    }
    else {
      QTransform::dx(local_2f8);
      QTransform::dy(local_2f8);
      QRectF::translated((QRectF *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                         (qreal)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                         (qreal)in_stack_fffffffffffffc40);
    }
    in_stack_fffffffffffffd02 = 0;
    if ((0.0 < (double)in_RDI[0x18].d) &&
       ((qVar13 = QRectF::width(&local_230), qVar13 < (double)in_RDI[0x18].d ||
        (qVar13 = QRectF::height(&local_230), qVar13 < (double)in_RDI[0x18].d)))) {
      in_stack_fffffffffffffd02 = 1;
      local_341 = 0;
    }
    in_stack_fffffffffffffd01 = 0;
    if ((local_341 & 1) != 0) {
      local_240._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_240._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_240 = QRectF::toAlignedRect();
      QRect::adjust((QRect *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                    in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48,
                    (int)((ulong)in_stack_fffffffffffffc40 >> 0x20),(int)in_stack_fffffffffffffc40);
      if (local_1f0 != (QWidget *)0x0) {
        QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
        operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                    *)((long)in_RSI + 8));
        in_stack_fffffffffffffcf0 =
             (piter)QHash<QWidget_*,_QRect>::insert
                              ((QHash<QWidget_*,_QRect> *)in_stack_fffffffffffffc40,
                               in_stack_fffffffffffffc38,(QRect *)0x9d705e);
      }
      if (in_R8 == (QRegion *)0x0) {
        local_250 = QRect::normalized();
        bVar3 = QRect::isEmpty(in_stack_fffffffffffffc40);
        local_341 = bVar3 ^ 0xff;
      }
      else {
        local_341 = QRegion::intersects((QRect *)in_R8);
      }
      local_341 = local_341 & 1;
      in_stack_fffffffffffffd01 = (local_341 ^ 0xff) & 1;
    }
    if (((in_stack_fffffffffffffd02 & 1) != 0) || (in_stack_fffffffffffffd01 != 0)) {
      if (bVar2 == 0) goto LAB_009d77db;
      if ((bVar15 & 1) != 0) {
        if ((bVar16 & 1) != 0) {
          QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
          operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                      *)((long)in_RSI + 8));
          QGraphicsItemPrivate::invalidateChildrenSceneTransform
                    ((QGraphicsItemPrivate *)
                     CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
        }
        goto LAB_009d77db;
      }
    }
  }
  if (((bVar2 != 0) && ((bVar15 & 1) != 0)) && (local_2f8 == (QTransform *)0x0)) {
    if (in_RCX == (QTransform *)0x0) {
      pQVar7 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)((long)in_RSI + 8));
      local_2f8 = &pQVar7->sceneTransform;
      pQVar7 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)((long)in_RSI + 8));
      bVar17 = (*(ulong *)&pQVar7->field_0x160 >> 0x3e & 1) != 0;
    }
    else {
      pQVar7 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)((long)in_RSI + 8));
      memcpy(&local_60,&pQVar7->sceneTransform,0x4a);
      QTransform::operator*=(&local_60,(QTransform *)in_RCX);
      local_2f8 = &local_60;
    }
  }
  pQVar7 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)((long)in_RSI + 8));
  if (pQVar7->graphicsEffect != (QGraphicsEffect *)0x0) {
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *
               )((long)in_RSI + 8));
    bVar3 = QGraphicsEffect::isEnabled((QGraphicsEffect *)in_stack_fffffffffffffc40);
    if (bVar3) {
      if (local_2f8 == (QTransform *)0x0) {
        if (in_RCX == (QTransform *)0x0) {
          pQVar7 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                 *)((long)in_RSI + 8));
          local_2f8 = &pQVar7->sceneTransform;
          QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
          operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                      *)((long)in_RSI + 8));
        }
        else {
          pQVar7 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                 *)((long)in_RSI + 8));
          memcpy(&local_60,&pQVar7->sceneTransform,0x4a);
          QTransform::operator*=(&local_60,(QTransform *)in_RCX);
          local_2f8 = &local_60;
        }
      }
      memcpy(&local_1e8,&DAT_00b45128,0x48);
      opt = (QStyleOptionGraphicsItem *)(in_RDI + 0x59);
      local_342 = 0;
      if (bVar12) {
        local_342 = bVar1 ^ 0xff;
      }
      uVar11 = local_342 & 1;
      pQVar14 = in_RDX;
      QGraphicsItemPaintInfo::QGraphicsItemPaintInfo
                (&local_1e8,in_RCX,local_2f8,in_stack_00000008,in_R8,local_1f0,opt,
                 (QPainter *)in_RDX,opacity_00,(bool)(bVar16 & 1),SUB41(uVar11,0));
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                  *)((long)in_RSI + 8));
      QGraphicsEffect::d_func((QGraphicsEffect *)0x9d7461);
      this_00 = QGraphicsEffectSource::d_func((QGraphicsEffectSource *)0x9d747a);
      *(QGraphicsItemPaintInfo **)&this_00[1].field_0x8 = &local_1e8;
      memcpy(local_150,&DAT_00b45170,0x50);
      pvVar8 = (void *)QPainter::worldTransform();
      memcpy(local_150,pvVar8,0x50);
      if (in_stack_00000008 == (QTransform *)0x0) {
        QPainter::setWorldTransform((QTransform *)in_RDX,SUB81(local_2f8,0));
      }
      else {
        QTransform::operator*(&local_1a0,(QTransform *)local_2f8);
        QPainter::setWorldTransform((QTransform *)in_RDX,SUB81(&local_1a0,0));
      }
      QPainter::setOpacity(opacity_00);
      CVar5 = QGraphicsEffectSourcePrivate::currentCachedSystem(this_00);
      if (CVar5 != LogicalCoordinates) {
        this_01 = (QGraphicsItemEffectSourcePrivate *)&this_00[1].field_0x10;
        pQVar9 = (QTransform *)QPainter::worldTransform();
        uVar10 = QTransform::operator!=((QTransform *)this_01,pQVar9);
        if ((uVar10 & 1) != 0) {
          iVar6 = QTransform::type();
          if (iVar6 < 2) {
            QPainter::worldTransform();
            iVar6 = QTransform::type();
            if (1 < iVar6) goto LAB_009d76d5;
            local_270 = 0xffffffffffffffff;
            local_268 = 0xffffffffffffffff;
            local_260 = 0xffffffffffffffff;
            local_258 = 0xffffffffffffffff;
            (**(code **)(*(long *)this_00 + 0x28))(&local_270,this_00,0);
            pQVar14 = this_00;
            QGraphicsEffectSourcePrivate::currentCachedMode(this_00);
            QGraphicsItemEffectSourcePrivate::paddedEffectRect
                      (this_01,(CoordinateSystem)((ulong)in_stack_fffffffffffffc60 >> 0x20),
                       (PixmapPadMode)in_stack_fffffffffffffc60,(QRectF *)this_00,
                       (bool *)CONCAT44(in_stack_fffffffffffffc54,uVar11));
            QRectF::toAlignedRect();
            this_00 = pQVar14;
            local_2a8[0] = QRect::topLeft((QRect *)opt);
            QGraphicsEffectSourcePrivate::setCachedOffset(pQVar14,local_2a8);
          }
          else {
LAB_009d76d5:
            QGraphicsEffectSourcePrivate::invalidateCache
                      (pQVar14,(InvalidateReason)((ulong)opt >> 0x20));
          }
          pvVar8 = (void *)QPainter::worldTransform();
          memcpy(&this_00[1].field_0x10,pvVar8,0x4a);
        }
      }
      pQVar7 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)((long)in_RSI + 8));
      (**(code **)(*(long *)pQVar7->graphicsEffect + 0x68))(pQVar7->graphicsEffect,in_RDX);
      QPainter::setWorldTransform((QTransform *)in_RDX,SUB81(local_150,0));
      *(undefined8 *)&this_00[1].field_0x8 = 0;
      goto LAB_009d77db;
    }
  }
  draw((QGraphicsScenePrivate *)
       CONCAT17(bVar17,CONCAT16(bVar16,CONCAT15(uVar4,CONCAT14(bVar15,CONCAT13(local_341,
                                                                               CONCAT12(
                                                  in_stack_fffffffffffffd02,
                                                  CONCAT11(in_stack_fffffffffffffd01,
                                                           in_stack_fffffffffffffd00))))))),
       (QGraphicsItem *)in_stack_fffffffffffffcf0.bucket,(QPainter *)in_stack_fffffffffffffcf0.d,
       in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,in_RDI,in_stack_fffffffffffffd70,
       in_stack_fffffffffffffcd0,in_stack_fffffffffffffd78,(bool)wasDirtyParentSceneTransform_00,
       (bool)drawItem_00);
LAB_009d77db:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::drawSubtreeRecursive(QGraphicsItem *item, QPainter *painter,
                                                 const QTransform *const viewTransform,
                                                 QRegion *exposedRegion, QWidget *widget,
                                                 qreal parentOpacity, const QTransform *const effectTransform)
{
    Q_ASSERT(item);

    if (!item->d_ptr->visible)
        return;

    const bool itemHasContents = !(item->d_ptr->flags & QGraphicsItem::ItemHasNoContents);
    const bool itemHasChildren = !item->d_ptr->children.isEmpty();
    if (!itemHasContents && !itemHasChildren)
        return; // Item has neither contents nor children!(?)

    const qreal opacity = item->d_ptr->combineOpacityFromParent(parentOpacity);
    const bool itemIsFullyTransparent = QGraphicsItemPrivate::isOpacityNull(opacity);
    if (itemIsFullyTransparent && (!itemHasChildren || item->d_ptr->childrenCombineOpacity()))
        return;

    QTransform transform(Qt::Uninitialized);
    QTransform *transformPtr = nullptr;
    bool translateOnlyTransform = false;
#define ENSURE_TRANSFORM_PTR \
    if (!transformPtr) { \
        Q_ASSERT(!itemIsUntransformable); \
        if (viewTransform) { \
            transform = item->d_ptr->sceneTransform; \
            transform *= *viewTransform; \
            transformPtr = &transform; \
        } else { \
            transformPtr = &item->d_ptr->sceneTransform; \
            translateOnlyTransform = item->d_ptr->sceneTransformTranslateOnly; \
        } \
    }

    // Update the item's scene transform if the item is transformable;
    // otherwise calculate the full transform,
    bool wasDirtyParentSceneTransform = false;
    const bool itemIsUntransformable = item->d_ptr->itemIsUntransformable();
    if (itemIsUntransformable) {
        transform = item->deviceTransform(viewTransform ? *viewTransform : QTransform());
        transformPtr = &transform;
    } else if (item->d_ptr->dirtySceneTransform) {
        item->d_ptr->updateSceneTransformFromParent();
        Q_ASSERT(!item->d_ptr->dirtySceneTransform);
        wasDirtyParentSceneTransform = true;
    }

    const bool itemClipsChildrenToShape = (item->d_ptr->flags & QGraphicsItem::ItemClipsChildrenToShape
                                           || item->d_ptr->flags & QGraphicsItem::ItemContainsChildrenInShape);
    bool drawItem = itemHasContents && !itemIsFullyTransparent;
    if (drawItem || minimumRenderSize > 0.0) {
        const QRectF brect = adjustedItemEffectiveBoundingRect(item);
        ENSURE_TRANSFORM_PTR
        QRectF preciseViewBoundingRect = translateOnlyTransform ? brect.translated(transformPtr->dx(), transformPtr->dy())
                                                                : transformPtr->mapRect(brect);

        bool itemIsTooSmallToRender = false;
        if (minimumRenderSize > 0.0
            && (preciseViewBoundingRect.width() < minimumRenderSize
                || preciseViewBoundingRect.height() < minimumRenderSize)) {
           itemIsTooSmallToRender = true;
           drawItem = false;
        }

        bool itemIsOutsideVisibleRect = false;
        if (drawItem) {
            QRect viewBoundingRect = preciseViewBoundingRect.toAlignedRect();
            viewBoundingRect.adjust(-int(rectAdjust), -int(rectAdjust), rectAdjust, rectAdjust);
            if (widget)
                item->d_ptr->paintedViewBoundingRects.insert(widget, viewBoundingRect);
            drawItem = exposedRegion ? exposedRegion->intersects(viewBoundingRect)
                                     : !viewBoundingRect.normalized().isEmpty();
            itemIsOutsideVisibleRect = !drawItem;
        }

        if (itemIsTooSmallToRender || itemIsOutsideVisibleRect) {
            // We cannot simply use !drawItem here. If we did it is possible
            // to enter the outer if statement with drawItem == false and minimumRenderSize > 0
            // and finally end up inside this inner if, even though none of the above two
            // conditions are met. In that case we should not return from this function
            // but call draw() instead.
            if (!itemHasChildren)
                return;
            if (itemClipsChildrenToShape) {
                if (wasDirtyParentSceneTransform)
                    item->d_ptr->invalidateChildrenSceneTransform();
                return;
            }
        }
    } // else we know for sure this item has children we must process.

    if (itemHasChildren && itemClipsChildrenToShape)
        ENSURE_TRANSFORM_PTR;

#if QT_CONFIG(graphicseffect)
    if (item->d_ptr->graphicsEffect && item->d_ptr->graphicsEffect->isEnabled()) {
        ENSURE_TRANSFORM_PTR;
        QGraphicsItemPaintInfo info(viewTransform, transformPtr, effectTransform, exposedRegion, widget, &styleOptionTmp,
                                    painter, opacity, wasDirtyParentSceneTransform, itemHasContents && !itemIsFullyTransparent);
        QGraphicsEffectSource *source = item->d_ptr->graphicsEffect->d_func()->source;
        QGraphicsItemEffectSourcePrivate *sourced = static_cast<QGraphicsItemEffectSourcePrivate *>
                                                    (source->d_func());
        sourced->info = &info;
        const QTransform restoreTransform = painter->worldTransform();
        if (effectTransform)
            painter->setWorldTransform(*transformPtr * *effectTransform);
        else
            painter->setWorldTransform(*transformPtr);
        painter->setOpacity(opacity);

        if (sourced->currentCachedSystem() != Qt::LogicalCoordinates
            && sourced->lastEffectTransform != painter->worldTransform())
        {
            if (sourced->lastEffectTransform.type() <= QTransform::TxTranslate
                && painter->worldTransform().type() <= QTransform::TxTranslate)
            {
                QRectF sourceRect = sourced->boundingRect(Qt::DeviceCoordinates);
                QRect effectRect = sourced->paddedEffectRect(Qt::DeviceCoordinates, sourced->currentCachedMode(), sourceRect).toAlignedRect();

                sourced->setCachedOffset(effectRect.topLeft());
            } else {
                sourced->invalidateCache(QGraphicsEffectSourcePrivate::TransformChanged);
            }

            sourced->lastEffectTransform = painter->worldTransform();
        }

        item->d_ptr->graphicsEffect->draw(painter);
        painter->setWorldTransform(restoreTransform);
        sourced->info = nullptr;
    } else
#endif // QT_CONFIG(graphicseffect)
    {
        draw(item, painter, viewTransform, transformPtr, exposedRegion, widget, opacity,
             effectTransform, wasDirtyParentSceneTransform, drawItem);
    }
}